

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O2

void __thiscall RleTaskScheduler::run(RleTaskScheduler *this,uint i)

{
  bool bVar1;
  ostream *poVar2;
  pthread_t __target_thread;
  int iVar3;
  SW_FT_Stroker stroker;
  VTask task;
  FTOutline outlineRef;
  ostringstream nameStream;
  SW_FT_Stroker local_260;
  shared_ptr<VRleTask> local_258 [2];
  FTOutline local_238;
  ostringstream local_1a8 [376];
  
  FTOutline::FTOutline(&local_238);
  SW_FT_Stroker_New(&local_260);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"lottie-tsk-");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  __target_thread = pthread_self();
  std::__cxx11::stringbuf::str();
  pthread_setname_np(__target_thread,
                     (char *)local_258[0].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  std::__cxx11::string::_M_dispose();
  local_258[0].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (VRleTask *)0x0;
  local_258[0].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar3 = 0;
LAB_00116122:
  if (iVar3 != this->_count * 2) goto LAB_00116142;
  bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::pop
                    ((this->_q).
                     super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + i,local_258);
  if (!bVar1) {
    SW_FT_Stroker_Done(local_260);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_258[0].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    FTOutline::~FTOutline(&local_238);
    return;
  }
  goto LAB_00116164;
LAB_00116142:
  bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
                    ((this->_q).
                     super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (ulong)(iVar3 + i) % (ulong)this->_count,local_258);
  iVar3 = iVar3 + 1;
  if (bVar1) {
LAB_00116164:
    VRleTask::operator()
              (local_258[0].super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_238,&local_260);
    iVar3 = 0;
  }
  goto LAB_00116122;
}

Assistant:

void run(unsigned i)
    {
        /*
         * initalize  per thread objects.
         */
        FTOutline     outlineRef;
        SW_FT_Stroker stroker;
        SW_FT_Stroker_New(&stroker);

        // Create Thread Name for Debugging (Linux)
#ifdef __linux__
        std::ostringstream nameStream;
        nameStream << "lottie-tsk-" << i;
        pthread_setname_np(pthread_self(), nameStream.str().c_str());
#endif

        // Task Loop
        VTask task;
        while (true) {
            bool success = false;

            for (unsigned n = 0; n != _count * 2; ++n) {
                if (_q[(i + n) % _count].try_pop(task)) {
                    success = true;
                    break;
                }
            }

            if (!success && !_q[i].pop(task)) break;

            (*task)(outlineRef, stroker);
        }

        // cleanup
        SW_FT_Stroker_Done(stroker);
    }